

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O2

void __thiscall FastPForLib::SIMDPFor::SIMDPFor(SIMDPFor *this)

{
  allocator_type local_12;
  allocator_type local_11;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c1f60;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->codedcopy,0x80,&local_11);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->miss,0x80,&local_12);
  return;
}

Assistant:

SIMDPFor() : codedcopy(BlockSize), miss(BlockSize) {}